

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void slang::ast::ParameterSymbol::fromSyntax
               (Scope *scope,ParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::ParameterSymbol_*> *results)

{
  bool bVar1;
  DeclaratorSyntax *pDVar2;
  SourceLocation SVar3;
  byte in_CL;
  byte in_DL;
  Scope *in_RDI;
  string_view sVar4;
  Scope *unaff_retaddr;
  SourceLocation in_stack_00000008;
  DiagCode in_stack_00000014;
  ParameterSymbol *param;
  SourceLocation loc;
  DeclaratorSyntax *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  DeclaratorSyntax *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SourceLocation in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x49fa37);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x49fa4e);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                           ((self_type *)in_stack_ffffffffffffff60,
                            (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                            in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x49fa7c);
    SVar3 = parsing::Token::location(&pDVar2->name);
    in_stack_ffffffffffffff60 = Scope::getCompilation(in_RDI);
    sVar4 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff70);
    BumpAllocator::
    emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&,bool&,bool&>
              ((BumpAllocator *)sVar4._M_len,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (SourceLocation *)in_stack_ffffffffffffff80,
               (bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (bool *)in_stack_ffffffffffffff70);
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x49fb02);
    ValueSymbol::setDeclaredType
              ((ValueSymbol *)in_stack_ffffffffffffff60,(DataTypeSyntax *)in_stack_ffffffffffffff58)
    ;
    ValueSymbol::setFromDeclarator
              ((ValueSymbol *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (pDVar2->initializer == (EqualsValueClauseSyntax *)0x0) {
      if ((in_CL & 1) == 0) {
        in_stack_ffffffffffffff8c = 0xe0006;
        Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
        in_stack_ffffffffffffff80 = SVar3;
      }
      else if ((in_DL & 1) != 0) {
        in_stack_ffffffffffffff7c = 0x6a0006;
        Scope::addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
        in_stack_ffffffffffffff70 = SVar3;
      }
    }
    SmallVectorBase<slang::ast::ParameterSymbol_*>::push_back
              ((SmallVectorBase<slang::ast::ParameterSymbol_*> *)in_stack_ffffffffffffff60,
               (ParameterSymbol **)in_stack_ffffffffffffff58);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void ParameterSymbol::fromSyntax(const Scope& scope, const ParameterDeclarationSyntax& syntax,
                                 bool isLocal, bool isPort,
                                 SmallVectorBase<ParameterSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<ParameterSymbol>(decl->name.valueText(), loc,
                                                                     isLocal, isPort);
        param->setDeclaredType(*syntax.type);
        param->setFromDeclarator(*decl);

        if (!decl->initializer) {
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }

        results.push_back(param);
    }
}